

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall wasm::Outlining::outline(Outlining *this,Module *module,Sequences *seqByFunc)

{
  Name name;
  Name name_00;
  bool bVar1;
  size_type __n;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  reference pNVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  iterator iVar8;
  Function *pFVar9;
  undefined1 local_358 [8];
  ReconstructStringifyWalker reconstruct;
  undefined1 auStack_a8 [8];
  Name func;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_90;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  allocator<wasm::Name> local_39;
  undefined1 local_38 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> keys;
  Sequences *seqByFunc_local;
  Module *module_local;
  Outlining *this_local;
  
  keys.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)seqByFunc;
  __n = std::
        unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
        ::size(seqByFunc);
  std::allocator<wasm::Name>::allocator(&local_39);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_38,__n,&local_39);
  std::allocator<wasm::Name>::~allocator(&local_39);
  iVar2 = std::
          unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
          ::begin(seqByFunc);
  iVar3 = std::
          unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
          ::end(seqByFunc);
  iVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_38);
  std::
  transform<std::__detail::_Node_iterator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,false,true>,__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>,wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(auto:1)_1_>
            (iVar2.
             super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_true>
             ._M_cur,iVar3.
                     super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>,_true>
                     ._M_cur,iVar4._M_current);
  __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                     ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_38);
  local_90._M_current =
       (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_90);
    if (!bVar1) break;
    pNVar5 = __gnu_cxx::
             __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2);
    auStack_a8 = (undefined1  [8])(pNVar5->super_IString).str._M_len;
    func.super_IString.str._M_len = (size_t)(pNVar5->super_IString).str._M_str;
    pmVar6 = std::
             unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
             ::operator[](seqByFunc,(key_type *)auStack_a8);
    iVar7 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::begin
                      (pmVar6);
    pmVar6 = std::
             unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
             ::operator[](seqByFunc,(key_type *)auStack_a8);
    iVar8 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::end
                      (pmVar6);
    std::
    sort<__gnu_cxx::__normal_iterator<wasm::OutliningSequence*,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>,wasm::Outlining::outline(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::OutliningSequence,std::allocator<wasm::OutliningSequence>>>>>)::_lambda(wasm::OutliningSequence,wasm::OutliningSequence)_1_>
              (iVar7._M_current,iVar8._M_current);
    name_00.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)auStack_a8;
    pFVar9 = Module::getFunction(module,name_00);
    ReconstructStringifyWalker::ReconstructStringifyWalker
              ((ReconstructStringifyWalker *)local_358,module,pFVar9);
    pmVar6 = std::
             unordered_map<wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>_>_>_>
             ::operator[](seqByFunc,(key_type *)auStack_a8);
    std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::operator=
              ((vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_> *)
               &reconstruct.state,pmVar6);
    name.super_IString.str._M_str = (char *)func.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)auStack_a8;
    pFVar9 = Module::getFunction(module,name);
    StringifyWalker<wasm::ReconstructStringifyWalker>::doWalkFunction
              ((StringifyWalker<wasm::ReconstructStringifyWalker> *)local_358,pFVar9);
    ReconstructStringifyWalker::~ReconstructStringifyWalker((ReconstructStringifyWalker *)local_358)
    ;
    __gnu_cxx::
    __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2);
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_38);
  return;
}

Assistant:

void outline(Module* module,
               Sequences seqByFunc
#if OUTLINING_DEBUG
               ,
               const HashStringifyWalker& stringify
#endif
  ) {
    // TODO: Make this a function-parallel sub-pass.
    std::vector<Name> keys(seqByFunc.size());
    std::transform(seqByFunc.begin(),
                   seqByFunc.end(),
                   keys.begin(),
                   [](auto pair) { return pair.first; });
    for (auto func : keys) {
      // During function reconstruction, a walker iterates thru each instruction
      // of a function, incrementing a counter to find matching sequences. As a
      // result, the sequences of a function must be sorted by
      // smallest start index, otherwise reconstruction will miss outlining a
      // repeat sequence.
      std::sort(seqByFunc[func].begin(),
                seqByFunc[func].end(),
                [](OutliningSequence a, OutliningSequence b) {
                  return a.startIdx < b.startIdx;
                });
      ReconstructStringifyWalker reconstruct(module, module->getFunction(func));
      reconstruct.sequences = std::move(seqByFunc[func]);
      ODBG(printReconstruct(module,
                            stringify.hashString,
                            stringify.exprs,
                            func,
                            reconstruct.sequences));
      reconstruct.doWalkFunction(module->getFunction(func));
    }
  }